

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::execute
          (DuplicateColsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_2,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_3,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u_00;
  uint *puVar1;
  uint *puVar2;
  fpclass_type fVar3;
  undefined4 uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int32_t iVar9;
  type_conflict5 tVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  undefined8 *puVar14;
  VarStatus VVar15;
  ulong uVar16;
  pointer pnVar17;
  long lVar18;
  VarStatus *pVVar19;
  undefined8 uVar20;
  cpp_dec_float<50U,_int,_void> *pcVar21;
  cpp_dec_float<50U,_int,_void> *pcVar22;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_24;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_22;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  cpp_dec_float<50U,_int,_void> local_1368;
  cpp_dec_float<50U,_int,_void> *local_1330;
  cpp_dec_float<50U,_int,_void> local_1328;
  cpp_dec_float<50U,_int,_void> local_12e8;
  double local_12a8;
  undefined8 uStack_12a0;
  undefined4 local_1298;
  uint uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  cpp_dec_float<50U,_int,_void> local_1288;
  cpp_dec_float<50U,_int,_void> local_1248;
  cpp_dec_float<50U,_int,_void> local_1210;
  cpp_dec_float<50U,_int,_void> local_11d8;
  cpp_dec_float<50U,_int,_void> local_1198;
  cpp_dec_float<50U,_int,_void> local_1158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1118;
  cpp_dec_float<50U,_int,_void> local_10d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1098;
  cpp_dec_float<50U,_int,_void> local_1058;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1018;
  cpp_dec_float<50U,_int,_void> local_fd8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f98;
  cpp_dec_float<50U,_int,_void> local_f58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f18;
  cpp_dec_float<50U,_int,_void> local_ed8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e98;
  cpp_dec_float<50U,_int,_void> local_e58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e18;
  cpp_dec_float<50U,_int,_void> local_dd8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d98;
  cpp_dec_float<50U,_int,_void> local_d58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d18;
  cpp_dec_float<50U,_int,_void> local_cd8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c98;
  cpp_dec_float<50U,_int,_void> local_c58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c18;
  cpp_dec_float<50U,_int,_void> local_bd8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ad8;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  int local_a70;
  undefined1 local_a6c;
  undefined8 local_a68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a58;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  int local_9f0;
  undefined1 local_9ec;
  undefined8 local_9e8;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined5 uStack_9c0;
  undefined3 uStack_9bb;
  undefined5 uStack_9b8;
  undefined8 uStack_9b3;
  undefined8 local_9a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_998;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined5 uStack_940;
  undefined3 uStack_93b;
  undefined5 uStack_938;
  undefined8 uStack_933;
  undefined8 local_928;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_918;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_898;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_858;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_818;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined5 uStack_7c0;
  undefined3 uStack_7bb;
  undefined5 uStack_7b8;
  undefined8 uStack_7b3;
  undefined8 local_7a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_798;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined5 uStack_740;
  undefined3 uStack_73b;
  undefined5 uStack_738;
  undefined8 uStack_733;
  undefined8 local_728;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_718;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_698;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_658;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_618;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_570;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_500;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_490;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_458;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_420;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_340;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (this->m_isFirst != false) {
    return;
  }
  if (this->m_isLast == true) {
    lVar13 = (long)(this->m_perm).thesize;
    if (lVar13 < 1) {
      return;
    }
    uVar16 = lVar13 + 1;
    lVar13 = lVar13 * 0xe + -2;
    do {
      lVar18 = (long)(this->m_perm).data[uVar16 - 2];
      if (-1 < lVar18) {
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((pnVar17->m_backend).data._M_elems + lVar13 + -4) =
             *(undefined8 *)(pnVar17[lVar18].m_backend.data._M_elems + 8);
        uVar20 = *(undefined8 *)&pnVar17[lVar18].m_backend.data;
        uVar7 = *(undefined8 *)(pnVar17[lVar18].m_backend.data._M_elems + 2);
        puVar2 = pnVar17[lVar18].m_backend.data._M_elems + 4;
        uVar8 = *(undefined8 *)(puVar2 + 2);
        puVar1 = (pnVar17->m_backend).data._M_elems + lVar13 + -8;
        *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
        *(undefined8 *)(puVar1 + 2) = uVar8;
        puVar2 = (pnVar17->m_backend).data._M_elems + lVar13 + -0xc;
        *(undefined8 *)puVar2 = uVar20;
        *(undefined8 *)(puVar2 + 2) = uVar7;
        (pnVar17->m_backend).data._M_elems[lVar13 + -2] = pnVar17[lVar18].m_backend.exp;
        *(bool *)((pnVar17->m_backend).data._M_elems + lVar13 + -1) = pnVar17[lVar18].m_backend.neg;
        iVar9 = pnVar17[lVar18].m_backend.prec_elem;
        puVar2 = (pnVar17->m_backend).data._M_elems + lVar13;
        puVar2[0] = pnVar17[lVar18].m_backend.fpclass;
        puVar2[1] = iVar9;
        pnVar17 = (r->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((pnVar17->m_backend).data._M_elems + lVar13 + -4) =
             *(undefined8 *)(pnVar17[lVar18].m_backend.data._M_elems + 8);
        uVar20 = *(undefined8 *)&pnVar17[lVar18].m_backend.data;
        uVar7 = *(undefined8 *)(pnVar17[lVar18].m_backend.data._M_elems + 2);
        puVar2 = pnVar17[lVar18].m_backend.data._M_elems + 4;
        uVar8 = *(undefined8 *)(puVar2 + 2);
        puVar1 = (pnVar17->m_backend).data._M_elems + lVar13 + -8;
        *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
        *(undefined8 *)(puVar1 + 2) = uVar8;
        puVar2 = (pnVar17->m_backend).data._M_elems + lVar13 + -0xc;
        *(undefined8 *)puVar2 = uVar20;
        *(undefined8 *)(puVar2 + 2) = uVar7;
        (pnVar17->m_backend).data._M_elems[lVar13 + -2] = pnVar17[lVar18].m_backend.exp;
        *(bool *)((pnVar17->m_backend).data._M_elems + lVar13 + -1) = pnVar17[lVar18].m_backend.neg;
        iVar9 = pnVar17[lVar18].m_backend.prec_elem;
        puVar2 = (pnVar17->m_backend).data._M_elems + lVar13;
        puVar2[0] = pnVar17[lVar18].m_backend.fpclass;
        puVar2[1] = iVar9;
        cStatus->data[uVar16 - 2] = cStatus->data[lVar18];
      }
      uVar16 = uVar16 - 1;
      lVar13 = lVar13 + -0xe;
    } while (1 < uVar16);
    return;
  }
  iVar12 = this->m_k;
  switch(cStatus->data[iVar12]) {
  case ON_UPPER:
    pnVar17 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8) =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
    uVar20 = *(undefined8 *)(this->m_upK).m_backend.data._M_elems;
    uVar7 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
    uVar8 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
    puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar17[iVar12].m_backend.data = uVar20;
    *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2) = uVar7;
    pnVar17[iVar12].m_backend.exp = (this->m_upK).m_backend.exp;
    pnVar17[iVar12].m_backend.neg = (this->m_upK).m_backend.neg;
    iVar9 = (this->m_upK).m_backend.prec_elem;
    pnVar17[iVar12].m_backend.fpclass = (this->m_upK).m_backend.fpclass;
    pnVar17[iVar12].m_backend.prec_elem = iVar9;
    if ((this->m_scale).m_backend.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_12e8,0,(type *)0x0);
      iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&(this->m_scale).m_backend,&local_12e8);
      if (0 < iVar12) {
        iVar12 = this->m_j;
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8) =
             *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
        uVar20 = *(undefined8 *)(this->m_upJ).m_backend.data._M_elems;
        uVar7 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2);
        uVar8 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6);
        puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4);
        *(undefined8 *)(puVar2 + 2) = uVar8;
        *(undefined8 *)&pnVar17[iVar12].m_backend.data = uVar20;
        *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2) = uVar7;
        pnVar17[iVar12].m_backend.exp = (this->m_upJ).m_backend.exp;
        pnVar17[iVar12].m_backend.neg = (this->m_upJ).m_backend.neg;
        iVar9 = (this->m_upJ).m_backend.prec_elem;
        pnVar17[iVar12].m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
        pnVar17[iVar12].m_backend.prec_elem = iVar9;
        if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) {
          VVar15 = ON_UPPER;
        }
        else {
          VVar15 = ON_UPPER;
          if ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) {
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&(this->m_loJ).m_backend,&(this->m_upJ).m_backend);
            VVar15 = (uint)(iVar12 == 0) * 2;
          }
        }
        cStatus->data[this->m_j] = VVar15;
        break;
      }
    }
LAB_0030c3c6:
    iVar12 = this->m_j;
    pnVar17 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8) =
         *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
    uVar20 = *(undefined8 *)(this->m_loJ).m_backend.data._M_elems;
    uVar7 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2);
    uVar8 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6);
    puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar17[iVar12].m_backend.data = uVar20;
    *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2) = uVar7;
    pnVar17[iVar12].m_backend.exp = (this->m_loJ).m_backend.exp;
    pnVar17[iVar12].m_backend.neg = (this->m_loJ).m_backend.neg;
    uVar4 = (this->m_loJ).m_backend.fpclass;
    uVar6 = (this->m_loJ).m_backend.prec_elem;
    pnVar17[iVar12].m_backend.fpclass = uVar4;
    pnVar17[iVar12].m_backend.prec_elem = uVar6;
    VVar15 = ON_LOWER;
    if ((uVar4 != 2) && ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&(this->m_loJ).m_backend,&(this->m_upJ).m_backend);
      VVar15 = (iVar12 == 0) + ON_LOWER;
    }
    goto LAB_0030c4b0;
  case ON_LOWER:
    pnVar17 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8) =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
    uVar20 = *(undefined8 *)(this->m_loK).m_backend.data._M_elems;
    uVar7 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
    uVar8 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
    puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar17[iVar12].m_backend.data = uVar20;
    *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2) = uVar7;
    pnVar17[iVar12].m_backend.exp = (this->m_loK).m_backend.exp;
    pnVar17[iVar12].m_backend.neg = (this->m_loK).m_backend.neg;
    iVar9 = (this->m_loK).m_backend.prec_elem;
    pnVar17[iVar12].m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    pnVar17[iVar12].m_backend.prec_elem = iVar9;
    if ((this->m_scale).m_backend.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_12e8,0,(type *)0x0);
      iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&(this->m_scale).m_backend,&local_12e8);
      if (0 < iVar12) goto LAB_0030c3c6;
    }
    iVar12 = this->m_j;
    pnVar17 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8) =
         *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
    uVar20 = *(undefined8 *)(this->m_upJ).m_backend.data._M_elems;
    uVar7 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2);
    uVar8 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6);
    puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar17[iVar12].m_backend.data = uVar20;
    *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2) = uVar7;
    pnVar17[iVar12].m_backend.exp = (this->m_upJ).m_backend.exp;
    pnVar17[iVar12].m_backend.neg = (this->m_upJ).m_backend.neg;
    iVar9 = (this->m_upJ).m_backend.prec_elem;
    pnVar17[iVar12].m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
    pnVar17[iVar12].m_backend.prec_elem = iVar9;
    VVar15 = ON_UPPER;
    if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
       ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&(this->m_loJ).m_backend,&(this->m_upJ).m_backend);
      VVar15 = (uint)(iVar12 == 0) * 2;
    }
LAB_0030c4b0:
    cStatus->data[this->m_j] = VVar15;
    break;
  case FIXED:
    iVar12 = this->m_j;
    pnVar17 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8) =
         *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
    uVar20 = *(undefined8 *)(this->m_loJ).m_backend.data._M_elems;
    uVar7 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2);
    uVar8 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6);
    puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar17[iVar12].m_backend.data = uVar20;
    *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2) = uVar7;
    pnVar17[iVar12].m_backend.exp = (this->m_loJ).m_backend.exp;
    pnVar17[iVar12].m_backend.neg = (this->m_loJ).m_backend.neg;
    iVar9 = (this->m_loJ).m_backend.prec_elem;
    pnVar17[iVar12].m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    pnVar17[iVar12].m_backend.prec_elem = iVar9;
    cStatus->data[this->m_j] = FIXED;
    break;
  case ZERO:
    pnVar5 = &this->m_loK;
    local_618.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
    local_618.m_backend.data._M_elems[0] = (this->m_loK).m_backend.data._M_elems[0];
    local_618.m_backend.data._M_elems[1] = (this->m_loK).m_backend.data._M_elems[1];
    local_618.m_backend.data._M_elems[2] = (this->m_loK).m_backend.data._M_elems[2];
    local_618.m_backend.data._M_elems[3] = (this->m_loK).m_backend.data._M_elems[3];
    local_618.m_backend.data._M_elems[4] = (this->m_loK).m_backend.data._M_elems[4];
    local_618.m_backend.data._M_elems[5] = (this->m_loK).m_backend.data._M_elems[5];
    local_618.m_backend.data._M_elems[6] = (this->m_loK).m_backend.data._M_elems[6];
    local_618.m_backend.data._M_elems[7] = (this->m_loK).m_backend.data._M_elems[7];
    local_618.m_backend.exp = (this->m_loK).m_backend.exp;
    local_618.m_backend.neg = (this->m_loK).m_backend.neg;
    local_618.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    local_618.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_68,this);
    bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_618,&local_68);
    if (bVar11) {
      local_658.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
      local_658.m_backend.data._M_elems[0] = (this->m_upK).m_backend.data._M_elems[0];
      local_658.m_backend.data._M_elems[1] = (this->m_upK).m_backend.data._M_elems[1];
      local_658.m_backend.data._M_elems[2] = (this->m_upK).m_backend.data._M_elems[2];
      local_658.m_backend.data._M_elems[3] = (this->m_upK).m_backend.data._M_elems[3];
      local_658.m_backend.data._M_elems[4] = (this->m_upK).m_backend.data._M_elems[4];
      local_658.m_backend.data._M_elems[5] = (this->m_upK).m_backend.data._M_elems[5];
      local_658.m_backend.data._M_elems[6] = (this->m_upK).m_backend.data._M_elems[6];
      local_658.m_backend.data._M_elems[7] = (this->m_upK).m_backend.data._M_elems[7];
      local_658.m_backend.exp = (this->m_upK).m_backend.exp;
      local_658.m_backend.neg = (this->m_upK).m_backend.neg;
      local_658.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
      local_658.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
      bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_658,&local_a0);
      if ((((!bVar11) || ((this->m_loK).m_backend.fpclass == cpp_dec_float_NaN)) ||
          ((this->m_upK).m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&pnVar5->m_backend,&(this->m_upK).m_backend), iVar12 != 0))
      goto LAB_0030bf78;
      VVar15 = FIXED;
    }
    else {
LAB_0030bf78:
      local_698.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
      local_698.m_backend.data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
      local_698.m_backend.data._M_elems[1] = (this->m_loK).m_backend.data._M_elems[1];
      local_698.m_backend.data._M_elems[2] = (this->m_loK).m_backend.data._M_elems[2];
      local_698.m_backend.data._M_elems[3] = (this->m_loK).m_backend.data._M_elems[3];
      local_698.m_backend.data._M_elems[4] = (this->m_loK).m_backend.data._M_elems[4];
      local_698.m_backend.data._M_elems[5] = (this->m_loK).m_backend.data._M_elems[5];
      local_698.m_backend.data._M_elems[6] = (this->m_loK).m_backend.data._M_elems[6];
      local_698.m_backend.data._M_elems[7] = (this->m_loK).m_backend.data._M_elems[7];
      local_698.m_backend.exp = (this->m_loK).m_backend.exp;
      local_698.m_backend.neg = (this->m_loK).m_backend.neg;
      local_698.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
      local_698.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_d8,this);
      bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_698,&local_d8);
      VVar15 = ON_LOWER;
      if (!bVar11) {
        local_6d8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
        local_6d8.m_backend.data._M_elems[0] = (this->m_upK).m_backend.data._M_elems[0];
        local_6d8.m_backend.data._M_elems[1] = (this->m_upK).m_backend.data._M_elems[1];
        local_6d8.m_backend.data._M_elems[2] = (this->m_upK).m_backend.data._M_elems[2];
        local_6d8.m_backend.data._M_elems[3] = (this->m_upK).m_backend.data._M_elems[3];
        local_6d8.m_backend.data._M_elems[4] = (this->m_upK).m_backend.data._M_elems[4];
        local_6d8.m_backend.data._M_elems[5] = (this->m_upK).m_backend.data._M_elems[5];
        local_6d8.m_backend.data._M_elems[6] = (this->m_upK).m_backend.data._M_elems[6];
        local_6d8.m_backend.data._M_elems[7] = (this->m_upK).m_backend.data._M_elems[7];
        local_6d8.m_backend.exp = (this->m_upK).m_backend.exp;
        local_6d8.m_backend.neg = (this->m_upK).m_backend.neg;
        local_6d8.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
        local_6d8.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_110,this);
        bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_6d8,&local_110);
        VVar15 = ON_UPPER;
        if (!bVar11) {
          local_718.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
          local_718.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar5->m_backend).data._M_elems
          ;
          local_718.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
          local_718.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
          local_718.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
          local_718.m_backend.exp = (this->m_loK).m_backend.exp;
          local_718.m_backend.neg = (this->m_loK).m_backend.neg;
          local_718.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
          local_718.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
          local_728 = 0xa00000000;
          local_758 = 0;
          uStack_750 = 0;
          local_748 = 0;
          uStack_740 = 0;
          uStack_73b = 0;
          uStack_738 = 0;
          uStack_733 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_758,0.0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_148,this);
          bVar11 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_718,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_758,&local_148);
          if (!bVar11) {
LAB_0030db71:
            puVar14 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_12e8.data._M_elems._0_8_ = local_12e8.data._M_elems + 4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_12e8,"XMAISM05 This should never happen.","");
            *puVar14 = &PTR__SPxException_0069d438;
            puVar14[1] = puVar14 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar14 + 1),local_12e8.data._M_elems._0_8_,
                       local_12e8.data._M_elems._0_8_ + local_12e8.data._M_elems._8_8_);
            *puVar14 = &PTR__SPxException_0069d410;
            __cxa_throw(puVar14,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          local_798.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
          local_798.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->m_upK).m_backend.data._M_elems;
          local_798.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
          local_798.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
          local_798.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
          local_798.m_backend.exp = (this->m_upK).m_backend.exp;
          local_798.m_backend.neg = (this->m_upK).m_backend.neg;
          local_798.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
          local_798.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
          local_7a8 = 0xa00000000;
          local_7d8 = 0;
          uStack_7d0 = 0;
          local_7c8 = 0;
          uStack_7c0 = 0;
          uStack_7bb = 0;
          uStack_7b8 = 0;
          uStack_7b3 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_7d8,0.0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_180,this);
          bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_798,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_7d8,&local_180);
          VVar15 = ZERO;
          if (!bVar11) goto LAB_0030db71;
        }
      }
    }
    cStatus->data[this->m_k] = VVar15;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)
               ((x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
    pnVar5 = &this->m_loJ;
    local_818.m_backend.data._M_elems[0] = (this->m_loJ).m_backend.data._M_elems[0];
    local_818.m_backend.data._M_elems[1] = (this->m_loJ).m_backend.data._M_elems[1];
    local_818.m_backend.data._M_elems[2] = (this->m_loJ).m_backend.data._M_elems[2];
    local_818.m_backend.data._M_elems[3] = (this->m_loJ).m_backend.data._M_elems[3];
    local_818.m_backend.data._M_elems[4] = (this->m_loJ).m_backend.data._M_elems[4];
    local_818.m_backend.data._M_elems[5] = (this->m_loJ).m_backend.data._M_elems[5];
    local_818.m_backend.data._M_elems[6] = (this->m_loJ).m_backend.data._M_elems[6];
    local_818.m_backend.data._M_elems[7] = (this->m_loJ).m_backend.data._M_elems[7];
    local_818.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
    local_818.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_818.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_818.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_818.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_1b8,this);
    bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_818,&local_1b8);
    if (bVar11) {
      local_858.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
      local_858.m_backend.data._M_elems[0] = (this->m_upJ).m_backend.data._M_elems[0];
      local_858.m_backend.data._M_elems[1] = (this->m_upJ).m_backend.data._M_elems[1];
      local_858.m_backend.data._M_elems[2] = (this->m_upJ).m_backend.data._M_elems[2];
      local_858.m_backend.data._M_elems[3] = (this->m_upJ).m_backend.data._M_elems[3];
      local_858.m_backend.data._M_elems[4] = (this->m_upJ).m_backend.data._M_elems[4];
      local_858.m_backend.data._M_elems[5] = (this->m_upJ).m_backend.data._M_elems[5];
      local_858.m_backend.data._M_elems[6] = (this->m_upJ).m_backend.data._M_elems[6];
      local_858.m_backend.data._M_elems[7] = (this->m_upJ).m_backend.data._M_elems[7];
      local_858.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_858.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_858.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_858.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_1f0,this);
      bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_858,&local_1f0);
      if (((bVar11) && ((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN)) &&
         (((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN &&
          (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&pnVar5->m_backend,&(this->m_upJ).m_backend), iVar12 == 0)))) {
        cStatus->data[this->m_j] = FIXED;
        break;
      }
    }
    local_898.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
    local_898.m_backend.data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    local_898.m_backend.data._M_elems[1] = (this->m_loJ).m_backend.data._M_elems[1];
    local_898.m_backend.data._M_elems[2] = (this->m_loJ).m_backend.data._M_elems[2];
    local_898.m_backend.data._M_elems[3] = (this->m_loJ).m_backend.data._M_elems[3];
    local_898.m_backend.data._M_elems[4] = (this->m_loJ).m_backend.data._M_elems[4];
    local_898.m_backend.data._M_elems[5] = (this->m_loJ).m_backend.data._M_elems[5];
    local_898.m_backend.data._M_elems[6] = (this->m_loJ).m_backend.data._M_elems[6];
    local_898.m_backend.data._M_elems[7] = (this->m_loJ).m_backend.data._M_elems[7];
    local_898.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_898.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_898.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_898.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_228,this);
    bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_898,&local_228);
    if (bVar11) {
      cStatus->data[this->m_j] = ON_LOWER;
    }
    else {
      local_8d8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
      local_8d8.m_backend.data._M_elems[0] = (this->m_upJ).m_backend.data._M_elems[0];
      local_8d8.m_backend.data._M_elems[1] = (this->m_upJ).m_backend.data._M_elems[1];
      local_8d8.m_backend.data._M_elems[2] = (this->m_upJ).m_backend.data._M_elems[2];
      local_8d8.m_backend.data._M_elems[3] = (this->m_upJ).m_backend.data._M_elems[3];
      local_8d8.m_backend.data._M_elems[4] = (this->m_upJ).m_backend.data._M_elems[4];
      local_8d8.m_backend.data._M_elems[5] = (this->m_upJ).m_backend.data._M_elems[5];
      local_8d8.m_backend.data._M_elems[6] = (this->m_upJ).m_backend.data._M_elems[6];
      local_8d8.m_backend.data._M_elems[7] = (this->m_upJ).m_backend.data._M_elems[7];
      local_8d8.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_8d8.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_8d8.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_8d8.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_260,this);
      bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_8d8,&local_260);
      if (!bVar11) {
        local_918.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
        local_918.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar5->m_backend).data._M_elems;
        local_918.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2);
        local_918.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4);
        local_918.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6);
        local_918.m_backend.exp = (this->m_loJ).m_backend.exp;
        local_918.m_backend.neg = (this->m_loJ).m_backend.neg;
        local_918.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
        local_918.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
        local_928 = 0xa00000000;
        local_958 = 0;
        uStack_950 = 0;
        local_948 = 0;
        uStack_940 = 0;
        uStack_93b = 0;
        uStack_938 = 0;
        uStack_933 = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_958,0.0);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_298,this);
        bVar11 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_918,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_958,&local_298);
        if (bVar11) {
          local_998.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8);
          local_998.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(this->m_upJ).m_backend.data._M_elems;
          local_998.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2);
          local_998.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4);
          local_998.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6);
          local_998.m_backend.exp = (this->m_upJ).m_backend.exp;
          local_998.m_backend.neg = (this->m_upJ).m_backend.neg;
          local_998.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
          local_998.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
          local_9a8 = 0xa00000000;
          local_9d8 = 0;
          uStack_9d0 = 0;
          local_9c8 = 0;
          uStack_9c0 = 0;
          uStack_9bb = 0;
          uStack_9b8 = 0;
          uStack_9b3 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9d8,0.0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_2d0,this);
          bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_998,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_9d8,&local_2d0);
          if (bVar11) {
            cStatus->data[this->m_j] = ZERO;
            break;
          }
        }
        puVar14 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_12e8.data._M_elems._0_8_ = local_12e8.data._M_elems + 4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_12e8,"XMAISM06 This should never happen.","");
        *puVar14 = &PTR__SPxException_0069d438;
        puVar14[1] = puVar14 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar14 + 1),local_12e8.data._M_elems._0_8_,
                   local_12e8.data._M_elems._0_8_ + local_12e8.data._M_elems._8_8_);
        *puVar14 = &PTR__SPxException_0069d410;
        __cxa_throw(puVar14,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      cStatus->data[this->m_j] = ON_UPPER;
    }
    break;
  case BASIC:
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_9f8 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    local_a18 = *(undefined8 *)pnVar5[iVar12].m_backend.data._M_elems;
    uStack_a10 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    local_a08 = *(undefined8 *)puVar2;
    uStack_a00 = *(undefined8 *)(puVar2 + 2);
    local_9f0 = pnVar5[iVar12].m_backend.exp;
    local_9ec = pnVar5[iVar12].m_backend.neg;
    local_9e8._0_4_ = pnVar5[iVar12].m_backend.fpclass;
    local_9e8._4_4_ = pnVar5[iVar12].m_backend.prec_elem;
    local_a58.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_loK).m_backend.data._M_elems;
    local_a58.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
    local_a58.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
    local_a58.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
    local_a58.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
    local_a58.m_backend.exp = (this->m_loK).m_backend.exp;
    local_a58.m_backend.neg = (this->m_loK).m_backend.neg;
    local_a58.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    local_a58.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_12e8,(soplex *)&local_a18,&local_a58,pnVar5);
    iVar12 = this->m_k;
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a78 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 8);
    local_a98 = *(undefined8 *)pnVar5[iVar12].m_backend.data._M_elems;
    uStack_a90 = *(undefined8 *)(pnVar5[iVar12].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar12].m_backend.data._M_elems + 4;
    local_a88 = *(undefined8 *)puVar2;
    uStack_a80 = *(undefined8 *)(puVar2 + 2);
    local_a70 = pnVar5[iVar12].m_backend.exp;
    local_a6c = pnVar5[iVar12].m_backend.neg;
    local_a68._0_4_ = pnVar5[iVar12].m_backend.fpclass;
    local_a68._4_4_ = pnVar5[iVar12].m_backend.prec_elem;
    local_ad8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_upK).m_backend.data._M_elems;
    local_ad8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
    local_ad8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
    local_ad8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
    local_ad8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
    local_ad8.m_backend.exp = (this->m_upK).m_backend.exp;
    local_ad8.m_backend.neg = (this->m_upK).m_backend.neg;
    local_ad8.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
    local_ad8.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_1210,(soplex *)&local_a98,&local_ad8,pnVar5);
    local_1248.data._M_elems[0] = 0;
    local_1248.data._M_elems[1] = 0x3ff00000;
    tVar10 = boost::multiprecision::operator<
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_12e8,(double *)&local_1248);
    if (tVar10) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_12e8,1.0);
    }
    pnVar5 = &this->m_loK;
    u = &this->m_upK;
    local_1248.data._M_elems[0] = 0;
    local_1248.data._M_elems[1] = 0x3ff00000;
    tVar10 = boost::multiprecision::operator<
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1210,(double *)&local_1248);
    if (tVar10) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1210,1.0);
    }
    local_1288.fpclass = cpp_dec_float_finite;
    local_1288.prec_elem = 10;
    local_1288.data._M_elems[0] = 0;
    local_1288.data._M_elems[1] = 0;
    local_1288.data._M_elems[2] = 0;
    local_1288.data._M_elems[3] = 0;
    local_1288.data._M_elems[4] = 0;
    local_1288.data._M_elems[5] = 0;
    local_1288.data._M_elems[6] = 0;
    local_1288.data._M_elems[7] = 0;
    local_1288.data._M_elems._32_5_ = 0;
    local_1288.data._M_elems[9]._1_3_ = 0;
    local_1288.exp = 0;
    local_1288.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_1288,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&local_12e8);
    local_1368.fpclass = cpp_dec_float_finite;
    local_1368.prec_elem = 10;
    local_1368.data._M_elems[0] = 0;
    local_1368.data._M_elems[1] = 0;
    local_1368.data._M_elems[2] = 0;
    local_1368.data._M_elems[3] = 0;
    local_1368.data._M_elems[4] = 0;
    local_1368.data._M_elems[5] = 0;
    local_1368.data._M_elems._24_5_ = 0;
    local_1368.data._M_elems[7]._1_3_ = 0;
    local_1368.data._M_elems._32_5_ = 0;
    local_1368.data._M_elems[9]._1_3_ = 0;
    local_1368.exp = 0;
    local_1368.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_1368,&pnVar5->m_backend,&local_12e8);
    local_1248.fpclass = cpp_dec_float_finite;
    local_1248.prec_elem = 10;
    local_1248.data._M_elems[0] = 0;
    local_1248.data._M_elems[1] = 0;
    local_1248.data._M_elems[2] = 0;
    local_1248.data._M_elems[3] = 0;
    local_1248.data._M_elems[4] = 0;
    local_1248.data._M_elems[5] = 0;
    local_1248.data._M_elems[6] = 0;
    local_1248.data._M_elems[7] = 0;
    local_1248.data._M_elems._32_5_ = 0;
    local_1248.data._M_elems[9]._1_3_ = 0;
    local_1248.exp = 0;
    local_1248.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_1248,&local_1288,&local_1368);
    local_1368.fpclass = cpp_dec_float_finite;
    local_1368.prec_elem = 10;
    local_1368.data._M_elems[0] = 0;
    local_1368.data._M_elems[1] = 0;
    local_1368.data._M_elems[2] = 0;
    local_1368.data._M_elems[3] = 0;
    local_1368.data._M_elems[4] = 0;
    local_1368.data._M_elems[5] = 0;
    local_1368.data._M_elems._24_5_ = 0;
    local_1368.data._M_elems[7]._1_3_ = 0;
    local_1368.data._M_elems._32_5_ = 0;
    local_1368.data._M_elems[9]._1_3_ = 0;
    local_1368.exp = 0;
    local_1368.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_1368,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&local_1210);
    local_1328.fpclass = cpp_dec_float_finite;
    local_1328.prec_elem = 10;
    local_1328.data._M_elems[0] = 0;
    local_1328.data._M_elems[1] = 0;
    local_1328.data._M_elems[2] = 0;
    local_1328.data._M_elems[3] = 0;
    local_1328.data._M_elems[4] = 0;
    local_1328.data._M_elems[5] = 0;
    local_1328.data._M_elems._24_5_ = 0;
    local_1328.data._M_elems[7]._1_3_ = 0;
    local_1328.data._M_elems._32_5_ = 0;
    local_1328.data._M_elems[9]._1_3_ = 0;
    local_1328.exp = 0;
    local_1328.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_1328,&u->m_backend,&local_1210);
    local_1288.fpclass = cpp_dec_float_finite;
    local_1288.prec_elem = 10;
    local_1288.data._M_elems[0] = 0;
    local_1288.data._M_elems[1] = 0;
    local_1288.data._M_elems[2] = 0;
    local_1288.data._M_elems[3] = 0;
    local_1288.data._M_elems[4] = 0;
    local_1288.data._M_elems[5] = 0;
    local_1288.data._M_elems[6] = 0;
    local_1288.data._M_elems[7] = 0;
    local_1288.data._M_elems._32_5_ = 0;
    local_1288.data._M_elems[9]._1_3_ = 0;
    local_1288.exp = 0;
    local_1288.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_1288,&local_1368,&local_1328);
    local_b18.m_backend.data._M_elems[0] = local_1248.data._M_elems[0];
    local_b18.m_backend.data._M_elems[1] = local_1248.data._M_elems[1];
    local_b18.m_backend.data._M_elems[2] = local_1248.data._M_elems[2];
    local_b18.m_backend.data._M_elems[3] = local_1248.data._M_elems[3];
    local_b18.m_backend.data._M_elems[4] = local_1248.data._M_elems[4];
    local_b18.m_backend.data._M_elems[5] = local_1248.data._M_elems[5];
    local_b18.m_backend.data._M_elems[6] = local_1248.data._M_elems[6];
    local_b18.m_backend.data._M_elems[7] = local_1248.data._M_elems[7];
    local_b18.m_backend.data._M_elems[9]._1_3_ = local_1248.data._M_elems[9]._1_3_;
    local_b18.m_backend.data._M_elems._32_5_ = local_1248.data._M_elems._32_5_;
    local_b18.m_backend.exp = local_1248.exp;
    local_b18.m_backend.neg = local_1248.neg;
    local_b18.m_backend.fpclass = local_1248.fpclass;
    local_b18.m_backend.prec_elem = local_1248.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_308,this);
    bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_b18,&local_308);
    if (bVar11) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1248,0.0);
    }
    local_b58.m_backend.data._M_elems[9]._1_3_ = local_1288.data._M_elems[9]._1_3_;
    local_b58.m_backend.data._M_elems._32_5_ = local_1288.data._M_elems._32_5_;
    local_b58.m_backend.data._M_elems[4] = local_1288.data._M_elems[4];
    local_b58.m_backend.data._M_elems[5] = local_1288.data._M_elems[5];
    local_b58.m_backend.data._M_elems[6] = local_1288.data._M_elems[6];
    local_b58.m_backend.data._M_elems[7] = local_1288.data._M_elems[7];
    local_b58.m_backend.data._M_elems[0] = local_1288.data._M_elems[0];
    local_b58.m_backend.data._M_elems[1] = local_1288.data._M_elems[1];
    local_b58.m_backend.data._M_elems[2] = local_1288.data._M_elems[2];
    local_b58.m_backend.data._M_elems[3] = local_1288.data._M_elems[3];
    local_b58.m_backend.exp = local_1288.exp;
    local_b58.m_backend.neg = local_1288.neg;
    local_b58.m_backend.fpclass = local_1288.fpclass;
    local_b58.m_backend.prec_elem = local_1288.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_340,this);
    bVar11 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_b58,&local_340);
    if (bVar11) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1288,0.0);
    }
    ::soplex::infinity::__tls_init();
    this_00 = &this->m_loJ;
    local_12a8 = *(double *)(in_FS_OFFSET + -8);
    local_1298 = SUB84(local_12a8,0);
    uStack_12a0 = 0;
    uStack_1294 = (uint)((ulong)local_12a8 >> 0x20) ^ 0x80000000;
    local_1368.fpclass = cpp_dec_float_finite;
    local_1368.prec_elem = 10;
    local_1368.data._M_elems[0] = 0;
    local_1368.data._M_elems[1] = 0;
    local_1368.data._M_elems[2] = 0;
    local_1368.data._M_elems[3] = 0;
    local_1368.data._M_elems[4] = 0;
    local_1368.data._M_elems[5] = 0;
    local_1368.data._M_elems._24_5_ = 0;
    local_1368.data._M_elems[7]._1_3_ = 0;
    local_1368.data._M_elems._32_5_ = 0;
    local_1368.data._M_elems[9]._1_3_ = 0;
    local_1368.exp = 0;
    local_1368.neg = false;
    uStack_1290 = 0;
    uStack_128c = 0x80000000;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1368,-local_12a8);
    if ((((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
        (local_1368.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&this_00->m_backend,&local_1368), iVar12 < 1)) {
      ::soplex::infinity::__tls_init();
      local_1328.fpclass = cpp_dec_float_finite;
      local_1328.prec_elem = 10;
      local_1328.data._M_elems[0] = 0;
      local_1328.data._M_elems[1] = 0;
      local_1328.data._M_elems[2] = 0;
      local_1328.data._M_elems[3] = 0;
      local_1328.data._M_elems[4] = 0;
      local_1328.data._M_elems[5] = 0;
      local_1328.data._M_elems._24_5_ = 0;
      local_1328.data._M_elems[7]._1_3_ = 0;
      local_1328.data._M_elems._32_5_ = 0;
      local_1328.data._M_elems[9]._1_3_ = 0;
      local_1328.exp = 0;
      local_1328.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1328,local_12a8);
      if ((((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_1328.fpclass != cpp_dec_float_NaN)) &&
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&(this->m_upJ).m_backend,&local_1328), -1 < iVar12)) {
        ::soplex::infinity::__tls_init();
        local_1198.fpclass = cpp_dec_float_finite;
        local_1198.prec_elem = 10;
        local_1198.data._M_elems[0] = 0;
        local_1198.data._M_elems[1] = 0;
        local_1198.data._M_elems[2] = 0;
        local_1198.data._M_elems[3] = 0;
        local_1198.data._M_elems[4] = 0;
        local_1198.data._M_elems[5] = 0;
        local_1198.data._M_elems._24_5_ = 0;
        local_1198.data._M_elems[7]._1_3_ = 0;
        local_1198.data._M_elems._32_5_ = 0;
        local_1198._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1198,
                   (double)CONCAT44(uStack_1294,local_1298));
        if ((((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_1198.fpclass != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&pnVar5->m_backend,&local_1198), iVar12 < 1)) {
          ::soplex::infinity::__tls_init();
          local_11d8.fpclass = cpp_dec_float_finite;
          local_11d8.prec_elem = 10;
          local_11d8.data._M_elems[0] = 0;
          local_11d8.data._M_elems[1] = 0;
          local_11d8.data._M_elems[2] = 0;
          local_11d8.data._M_elems[3] = 0;
          local_11d8.data._M_elems[4] = 0;
          local_11d8.data._M_elems[5] = 0;
          local_11d8.data._M_elems._24_5_ = 0;
          local_11d8.data._M_elems[7]._1_3_ = 0;
          local_11d8.data._M_elems._32_5_ = 0;
          local_11d8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_11d8,local_12a8);
          if ((((this->m_upK).m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_11d8.fpclass != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&u->m_backend,&local_11d8), -1 < iVar12)) {
            iVar12 = this->m_j;
            cStatus->data[iVar12] = ZERO;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)
                       ((x->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar12),0.0);
            break;
          }
        }
      }
    }
    u_00 = &this->m_scale;
    local_1368.data._M_elems[0] = 0;
    local_1368.data._M_elems[1] = 0;
    tVar10 = boost::multiprecision::operator>(u_00,(double *)&local_1368);
    pnVar17 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_k;
    if (tVar10) {
      local_b98.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((pnVar17->m_backend).data._M_elems + 8);
      local_b98.m_backend.data._M_elems._0_8_ = *(undefined8 *)&(pnVar17->m_backend).data;
      local_b98.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((pnVar17->m_backend).data._M_elems + 2);
      local_b98.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((pnVar17->m_backend).data._M_elems + 4);
      local_b98.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((pnVar17->m_backend).data._M_elems + 6);
      local_b98.m_backend.exp = (pnVar17->m_backend).exp;
      local_b98.m_backend.neg = (pnVar17->m_backend).neg;
      local_b98.m_backend.fpclass = (pnVar17->m_backend).fpclass;
      local_b98.m_backend.prec_elem = (pnVar17->m_backend).prec_elem;
      local_1330 = &(this->m_upJ).m_backend;
      local_1368.fpclass = cpp_dec_float_finite;
      local_1368.prec_elem = 10;
      local_1368.data._M_elems[0] = 0;
      local_1368.data._M_elems[1] = 0;
      local_1368.data._M_elems[2] = 0;
      local_1368.data._M_elems[3] = 0;
      local_1368.data._M_elems[4] = 0;
      local_1368.data._M_elems[5] = 0;
      local_1368.data._M_elems._24_5_ = 0;
      local_1368.data._M_elems[7]._1_3_ = 0;
      local_1368.data._M_elems._32_5_ = 0;
      local_1368.data._M_elems[9]._1_3_ = 0;
      local_1368.exp = 0;
      local_1368.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_1368,&u_00->m_backend,local_1330);
      local_bd8.fpclass = cpp_dec_float_finite;
      local_bd8.prec_elem = 10;
      local_bd8.data._M_elems[0] = 0;
      local_bd8.data._M_elems[1] = 0;
      local_bd8.data._M_elems[2] = 0;
      local_bd8.data._M_elems[3] = 0;
      local_bd8.data._M_elems[4] = 0;
      local_bd8.data._M_elems[5] = 0;
      local_bd8.data._M_elems._24_5_ = 0;
      local_bd8.data._M_elems[7]._1_3_ = 0;
      local_bd8.data._M_elems._32_5_ = 0;
      local_bd8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_bd8,&u->m_backend,&local_1368);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_378,this);
      bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_b98,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_bd8,&local_378);
      pcVar22 = local_1330;
      if (!bVar11) {
        iVar12 = this->m_k;
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_c18.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8);
        local_c18.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[iVar12].m_backend.data;
        local_c18.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2);
        puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
        local_c18.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_c18.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_c18.m_backend.exp = pnVar17[iVar12].m_backend.exp;
        local_c18.m_backend.neg = pnVar17[iVar12].m_backend.neg;
        local_c18.m_backend.fpclass = pnVar17[iVar12].m_backend.fpclass;
        local_c18.m_backend.prec_elem = pnVar17[iVar12].m_backend.prec_elem;
        local_1368.fpclass = cpp_dec_float_finite;
        local_1368.prec_elem = 10;
        local_1368.data._M_elems[0] = 0;
        local_1368.data._M_elems[1] = 0;
        local_1368.data._M_elems[2] = 0;
        local_1368.data._M_elems[3] = 0;
        local_1368.data._M_elems[4] = 0;
        local_1368.data._M_elems[5] = 0;
        local_1368.data._M_elems._24_5_ = 0;
        local_1368.data._M_elems[7]._1_3_ = 0;
        local_1368.data._M_elems._32_5_ = 0;
        local_1368.data._M_elems[9]._1_3_ = 0;
        local_1368.exp = 0;
        local_1368.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1368,&u_00->m_backend,local_1330);
        local_c58.fpclass = cpp_dec_float_finite;
        local_c58.prec_elem = 10;
        local_c58.data._M_elems[0] = 0;
        local_c58.data._M_elems[1] = 0;
        local_c58.data._M_elems[2] = 0;
        local_c58.data._M_elems[3] = 0;
        local_c58.data._M_elems[4] = 0;
        local_c58.data._M_elems[5] = 0;
        local_c58.data._M_elems._24_5_ = 0;
        local_c58.data._M_elems[7]._1_3_ = 0;
        local_c58.data._M_elems._32_5_ = 0;
        local_c58._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_c58,&pnVar5->m_backend,&local_1368);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_3b0,this);
        bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_c18,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_c58,&local_3b0);
        if (bVar11) {
          ::soplex::infinity::__tls_init();
          local_1328.fpclass = cpp_dec_float_finite;
          local_1328.prec_elem = 10;
          local_1328.data._M_elems[0] = 0;
          local_1328.data._M_elems[1] = 0;
          local_1328.data._M_elems[2] = 0;
          local_1328.data._M_elems[3] = 0;
          local_1328.data._M_elems[4] = 0;
          local_1328.data._M_elems[5] = 0;
          local_1328.data._M_elems._24_5_ = 0;
          local_1328.data._M_elems[7]._1_3_ = 0;
          local_1328.data._M_elems._32_5_ = 0;
          local_1328.data._M_elems[9]._1_3_ = 0;
          local_1328.exp = 0;
          local_1328.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1328,local_12a8);
          if ((((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_1328.fpclass != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar22,&local_1328), iVar12 < 0)) {
            if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) goto LAB_0030d89b;
            fVar3 = (this->m_upJ).m_backend.fpclass;
            goto LAB_0030bddb;
          }
        }
        iVar12 = this->m_k;
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_c98.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8);
        local_c98.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[iVar12].m_backend.data;
        local_c98.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2);
        puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
        local_c98.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_c98.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_c98.m_backend.exp = pnVar17[iVar12].m_backend.exp;
        local_c98.m_backend.neg = pnVar17[iVar12].m_backend.neg;
        local_c98.m_backend.fpclass = pnVar17[iVar12].m_backend.fpclass;
        local_c98.m_backend.prec_elem = pnVar17[iVar12].m_backend.prec_elem;
        local_1368.fpclass = cpp_dec_float_finite;
        local_1368.prec_elem = 10;
        local_1368.data._M_elems[0] = 0;
        local_1368.data._M_elems[1] = 0;
        local_1368.data._M_elems[2] = 0;
        local_1368.data._M_elems[3] = 0;
        local_1368.data._M_elems[4] = 0;
        local_1368.data._M_elems[5] = 0;
        local_1368.data._M_elems._24_5_ = 0;
        local_1368.data._M_elems[7]._1_3_ = 0;
        local_1368.data._M_elems._32_5_ = 0;
        local_1368.data._M_elems[9]._1_3_ = 0;
        local_1368.exp = 0;
        local_1368.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1368,&u_00->m_backend,&this_00->m_backend);
        local_cd8.fpclass = cpp_dec_float_finite;
        local_cd8.prec_elem = 10;
        local_cd8.data._M_elems[0] = 0;
        local_cd8.data._M_elems[1] = 0;
        local_cd8.data._M_elems[2] = 0;
        local_cd8.data._M_elems[3] = 0;
        local_cd8.data._M_elems[4] = 0;
        local_cd8.data._M_elems[5] = 0;
        local_cd8.data._M_elems._24_5_ = 0;
        local_cd8.data._M_elems[7]._1_3_ = 0;
        local_cd8.data._M_elems._32_5_ = 0;
        local_cd8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_cd8,&u->m_backend,&local_1368);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_3e8,this);
        bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_c98,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_cd8,&local_3e8);
        if (bVar11) {
          ::soplex::infinity::__tls_init();
          local_1328.fpclass = cpp_dec_float_finite;
          local_1328.prec_elem = 10;
          local_1328.data._M_elems[0] = 0;
          local_1328.data._M_elems[1] = 0;
          local_1328.data._M_elems[2] = 0;
          local_1328.data._M_elems[3] = 0;
          local_1328.data._M_elems[4] = 0;
          local_1328.data._M_elems[5] = 0;
          local_1328.data._M_elems._24_5_ = 0;
          local_1328.data._M_elems[7]._1_3_ = 0;
          local_1328.data._M_elems._32_5_ = 0;
          local_1328.data._M_elems[9]._1_3_ = 0;
          local_1328.exp = 0;
          local_1328.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1328,local_12a8);
          if ((((this->m_upK).m_backend.fpclass == cpp_dec_float_NaN) ||
              (local_1328.fpclass == cpp_dec_float_NaN)) ||
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&u->m_backend,&local_1328), -1 < iVar12)) goto LAB_0030cee0;
          if ((this->m_loK).m_backend.fpclass == cpp_dec_float_NaN) goto LAB_0030da3a;
          fVar3 = (this->m_upK).m_backend.fpclass;
LAB_0030ceb3:
          VVar15 = ON_UPPER;
          if (fVar3 != cpp_dec_float_NaN) {
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&pnVar5->m_backend,&u->m_backend);
            VVar15 = (uint)(iVar12 == 0) * 2;
          }
LAB_0030da3f:
          iVar12 = this->m_k;
          cStatus->data[iVar12] = VVar15;
          pnVar17 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8) =
               *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8);
          uVar20 = *(undefined8 *)(u->m_backend).data._M_elems;
          uVar7 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2);
          uVar8 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6);
          puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4);
          *(undefined8 *)(puVar2 + 2) = uVar8;
          *(undefined8 *)&pnVar17[iVar12].m_backend.data = uVar20;
          *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2) = uVar7;
          pnVar17[iVar12].m_backend.exp = (this->m_upK).m_backend.exp;
          pnVar17[iVar12].m_backend.neg = (this->m_upK).m_backend.neg;
          iVar9 = (this->m_upK).m_backend.prec_elem;
          pnVar17[iVar12].m_backend.fpclass = (this->m_upK).m_backend.fpclass;
          pnVar17[iVar12].m_backend.prec_elem = iVar9;
          cStatus->data[this->m_j] = BASIC;
          local_1328.data._M_elems._32_5_ = local_1288.data._M_elems._32_5_;
          local_1328.data._M_elems[9]._1_3_ = local_1288.data._M_elems[9]._1_3_;
          local_1328.data._M_elems[4] = local_1288.data._M_elems[4];
          local_1328.data._M_elems[5] = local_1288.data._M_elems[5];
          local_1328.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_1288.data._M_elems[7],local_1288.data._M_elems[6]),0);
          local_1328.data._M_elems[7]._1_3_ = (undefined3)(local_1288.data._M_elems[7] >> 8);
          local_1328.data._M_elems[0] = local_1288.data._M_elems[0];
          local_1328.data._M_elems[1] = local_1288.data._M_elems[1];
          local_1328.data._M_elems[2] = local_1288.data._M_elems[2];
          local_1328.data._M_elems[3] = local_1288.data._M_elems[3];
          local_1328.exp = local_1288.exp;
          local_1328.neg = local_1288.neg;
          local_1328.fpclass = local_1288.fpclass;
          local_1328.prec_elem = local_1288.prec_elem;
          pcVar22 = &local_1210;
          goto LAB_0030daf1;
        }
LAB_0030cee0:
        iVar12 = this->m_k;
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_d18.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8);
        local_d18.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[iVar12].m_backend.data;
        local_d18.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2);
        puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
        local_d18.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_d18.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_d18.m_backend.exp = pnVar17[iVar12].m_backend.exp;
        local_d18.m_backend.neg = pnVar17[iVar12].m_backend.neg;
        local_d18.m_backend.fpclass = pnVar17[iVar12].m_backend.fpclass;
        local_d18.m_backend.prec_elem = pnVar17[iVar12].m_backend.prec_elem;
        local_1368.fpclass = cpp_dec_float_finite;
        local_1368.prec_elem = 10;
        local_1368.data._M_elems[0] = 0;
        local_1368.data._M_elems[1] = 0;
        local_1368.data._M_elems[2] = 0;
        local_1368.data._M_elems[3] = 0;
        local_1368.data._M_elems[4] = 0;
        local_1368.data._M_elems[5] = 0;
        local_1368.data._M_elems._24_5_ = 0;
        local_1368.data._M_elems[7]._1_3_ = 0;
        local_1368.data._M_elems._32_5_ = 0;
        local_1368.data._M_elems[9]._1_3_ = 0;
        local_1368.exp = 0;
        local_1368.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1368,&u_00->m_backend,&this_00->m_backend);
        local_d58.fpclass = cpp_dec_float_finite;
        local_d58.prec_elem = 10;
        local_d58.data._M_elems[0] = 0;
        local_d58.data._M_elems[1] = 0;
        local_d58.data._M_elems[2] = 0;
        local_d58.data._M_elems[3] = 0;
        local_d58.data._M_elems[4] = 0;
        local_d58.data._M_elems[5] = 0;
        local_d58.data._M_elems._24_5_ = 0;
        local_d58.data._M_elems[7]._1_3_ = 0;
        local_d58.data._M_elems._32_5_ = 0;
        local_d58._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_d58,&pnVar5->m_backend,&local_1368);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_420,this);
        bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_d18,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_d58,&local_420);
        if (bVar11) {
          ::soplex::infinity::__tls_init();
          local_1328.fpclass = cpp_dec_float_finite;
          local_1328.prec_elem = 10;
          local_1328.data._M_elems[0] = 0;
          local_1328.data._M_elems[1] = 0;
          local_1328.data._M_elems[2] = 0;
          local_1328.data._M_elems[3] = 0;
          local_1328.data._M_elems[4] = 0;
          local_1328.data._M_elems[5] = 0;
          local_1328.data._M_elems._24_5_ = 0;
          local_1328.data._M_elems[7]._1_3_ = 0;
          local_1328.data._M_elems._32_5_ = 0;
          local_1328.data._M_elems[9]._1_3_ = 0;
          local_1328.exp = 0;
          local_1328.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1328,
                     (double)CONCAT44(uStack_1294,local_1298));
          if ((((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) ||
              (local_1328.fpclass == cpp_dec_float_NaN)) ||
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&this_00->m_backend,&local_1328), iVar12 < 1)) goto LAB_0030d1b9;
          if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) goto LAB_0030d73e;
          fVar3 = (this->m_upJ).m_backend.fpclass;
LAB_0030d5b0:
          VVar15 = ON_LOWER;
          if (fVar3 != cpp_dec_float_NaN) {
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&this_00->m_backend,local_1330);
            VVar15 = (iVar12 == 0) + ON_LOWER;
          }
        }
        else {
LAB_0030d1b9:
          iVar12 = this->m_k;
          pnVar17 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_d98.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8);
          local_d98.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[iVar12].m_backend.data;
          local_d98.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2);
          puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
          local_d98.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_d98.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_d98.m_backend.exp = pnVar17[iVar12].m_backend.exp;
          local_d98.m_backend.neg = pnVar17[iVar12].m_backend.neg;
          local_d98.m_backend.fpclass = pnVar17[iVar12].m_backend.fpclass;
          local_d98.m_backend.prec_elem = pnVar17[iVar12].m_backend.prec_elem;
          local_1368.fpclass = cpp_dec_float_finite;
          local_1368.prec_elem = 10;
          local_1368.data._M_elems[0] = 0;
          local_1368.data._M_elems[1] = 0;
          local_1368.data._M_elems[2] = 0;
          local_1368.data._M_elems[3] = 0;
          local_1368.data._M_elems[4] = 0;
          local_1368.data._M_elems[5] = 0;
          local_1368.data._M_elems._24_5_ = 0;
          local_1368.data._M_elems[7]._1_3_ = 0;
          local_1368.data._M_elems._32_5_ = 0;
          local_1368.data._M_elems[9]._1_3_ = 0;
          local_1368.exp = 0;
          local_1368.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_1368,&u_00->m_backend,&this_00->m_backend);
          local_dd8.fpclass = cpp_dec_float_finite;
          local_dd8.prec_elem = 10;
          local_dd8.data._M_elems[0] = 0;
          local_dd8.data._M_elems[1] = 0;
          local_dd8.data._M_elems[2] = 0;
          local_dd8.data._M_elems[3] = 0;
          local_dd8.data._M_elems[4] = 0;
          local_dd8.data._M_elems[5] = 0;
          local_dd8.data._M_elems._24_5_ = 0;
          local_dd8.data._M_elems[7]._1_3_ = 0;
          local_dd8.data._M_elems._32_5_ = 0;
          local_dd8._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_dd8,&pnVar5->m_backend,&local_1368);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_458,this);
          bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_d98,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_dd8,&local_458);
          if (bVar11) {
            ::soplex::infinity::__tls_init();
            local_1328.fpclass = cpp_dec_float_finite;
            local_1328.prec_elem = 10;
            local_1328.data._M_elems[0] = 0;
            local_1328.data._M_elems[1] = 0;
            local_1328.data._M_elems[2] = 0;
            local_1328.data._M_elems[3] = 0;
            local_1328.data._M_elems[4] = 0;
            local_1328.data._M_elems[5] = 0;
            local_1328.data._M_elems._24_5_ = 0;
            local_1328.data._M_elems[7]._1_3_ = 0;
            local_1328.data._M_elems._32_5_ = 0;
            local_1328.data._M_elems[9]._1_3_ = 0;
            local_1328.exp = 0;
            local_1328.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_1328,
                       (double)CONCAT44(uStack_1294,local_1298));
            if ((((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) &&
                (local_1328.fpclass != cpp_dec_float_NaN)) &&
               (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&pnVar5->m_backend,&local_1328), 0 < iVar12)) {
              if ((this->m_loK).m_backend.fpclass == cpp_dec_float_NaN) goto LAB_0030d7db;
              fVar3 = (this->m_upK).m_backend.fpclass;
LAB_0030d48b:
              VVar15 = ON_LOWER;
              if (fVar3 != cpp_dec_float_NaN) {
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&pnVar5->m_backend,&u->m_backend);
                VVar15 = (iVar12 == 0) + ON_LOWER;
              }
              goto LAB_0030d7e0;
            }
          }
          iVar12 = this->m_k;
          pnVar17 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_e18.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8);
          local_e18.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[iVar12].m_backend.data;
          local_e18.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2);
          puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
          local_e18.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_e18.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_e18.m_backend.exp = pnVar17[iVar12].m_backend.exp;
          local_e18.m_backend.neg = pnVar17[iVar12].m_backend.neg;
          local_e18.m_backend.fpclass = pnVar17[iVar12].m_backend.fpclass;
          local_e18.m_backend.prec_elem = pnVar17[iVar12].m_backend.prec_elem;
          local_1368.fpclass = cpp_dec_float_finite;
          local_1368.prec_elem = 10;
          local_1368.data._M_elems[0] = 0;
          local_1368.data._M_elems[1] = 0;
          local_1368.data._M_elems[2] = 0;
          local_1368.data._M_elems[3] = 0;
          local_1368.data._M_elems[4] = 0;
          local_1368.data._M_elems[5] = 0;
          local_1368.data._M_elems._24_5_ = 0;
          local_1368.data._M_elems[7]._1_3_ = 0;
          local_1368.data._M_elems._32_5_ = 0;
          local_1368.data._M_elems[9]._1_3_ = 0;
          local_1368.exp = 0;
          local_1368.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_1368,&u_00->m_backend,&this_00->m_backend);
          local_e58.fpclass = cpp_dec_float_finite;
          local_e58.prec_elem = 10;
          local_e58.data._M_elems[0] = 0;
          local_e58.data._M_elems[1] = 0;
          local_e58.data._M_elems[2] = 0;
          local_e58.data._M_elems[3] = 0;
          local_e58.data._M_elems[4] = 0;
          local_e58.data._M_elems[5] = 0;
          local_e58.data._M_elems._24_5_ = 0;
          local_e58.data._M_elems[7]._1_3_ = 0;
          local_e58.data._M_elems._32_5_ = 0;
          local_e58._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_e58,&pnVar5->m_backend,&local_1368);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_490,this);
          bVar11 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_e18,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_e58,&local_490);
          if (!bVar11) {
            puVar14 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_1368.data._M_elems._0_8_ = local_1368.data._M_elems + 4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1368,"XMAISM08 This should never happen.","");
            *puVar14 = &PTR__SPxException_0069d438;
            puVar14[1] = puVar14 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar14 + 1),local_1368.data._M_elems._0_8_,
                       (undefined1 *)
                       (local_1368.data._M_elems._0_8_ + local_1368.data._M_elems._8_8_));
            *puVar14 = &PTR__SPxException_0069d410;
            __cxa_throw(puVar14,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          if ((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) {
            fVar3 = (this->m_upJ).m_backend.fpclass;
            goto LAB_0030d5b0;
          }
LAB_0030d73e:
          VVar15 = ON_LOWER;
        }
        iVar12 = this->m_j;
        pVVar19 = cStatus->data;
        goto LAB_0030d74b;
      }
      if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0030d89b:
        VVar15 = ON_UPPER;
      }
      else {
        fVar3 = (this->m_upJ).m_backend.fpclass;
LAB_0030bddb:
        VVar15 = ON_UPPER;
        if (fVar3 != cpp_dec_float_NaN) {
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&this_00->m_backend,pcVar22);
          VVar15 = (uint)(iVar12 == 0) * 2;
        }
      }
      iVar12 = this->m_j;
      pVVar19 = cStatus->data;
LAB_0030d8b2:
      lVar13 = (long)iVar12;
      pVVar19[lVar13] = VVar15;
      pnVar17 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar17[lVar13].m_backend.data._M_elems + 8) =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar22->data)->data)._M_elems + 8);
      uVar20 = *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar22->data)->data)._M_elems;
      uVar7 = *(undefined8 *)
               ((((cpp_dec_float<50U,_int,_void> *)&pcVar22->data)->data)._M_elems + 2);
      uVar8 = *(undefined8 *)
               ((((cpp_dec_float<50U,_int,_void> *)&pcVar22->data)->data)._M_elems + 6);
      puVar2 = pnVar17[lVar13].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar22->data)->data)._M_elems + 4);
      *(undefined8 *)(puVar2 + 2) = uVar8;
      *(undefined8 *)&pnVar17[lVar13].m_backend.data = uVar20;
      *(undefined8 *)(pnVar17[lVar13].m_backend.data._M_elems + 2) = uVar7;
      pnVar17[lVar13].m_backend.exp = (this->m_upJ).m_backend.exp;
      pnVar17[lVar13].m_backend.neg = (this->m_upJ).m_backend.neg;
      uVar20._0_4_ = (this->m_upJ).m_backend.fpclass;
      uVar20._4_4_ = (this->m_upJ).m_backend.prec_elem;
    }
    else {
      local_e98.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((pnVar17->m_backend).data._M_elems + 8);
      local_e98.m_backend.data._M_elems._0_8_ = *(undefined8 *)&(pnVar17->m_backend).data;
      local_e98.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((pnVar17->m_backend).data._M_elems + 2);
      local_e98.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((pnVar17->m_backend).data._M_elems + 4);
      local_e98.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((pnVar17->m_backend).data._M_elems + 6);
      local_e98.m_backend.exp = (pnVar17->m_backend).exp;
      local_e98.m_backend.neg = (pnVar17->m_backend).neg;
      local_e98.m_backend.fpclass = (pnVar17->m_backend).fpclass;
      local_e98.m_backend.prec_elem = (pnVar17->m_backend).prec_elem;
      local_1368.fpclass = cpp_dec_float_finite;
      local_1368.prec_elem = 10;
      local_1368.data._M_elems[0] = 0;
      local_1368.data._M_elems[1] = 0;
      local_1368.data._M_elems[2] = 0;
      local_1368.data._M_elems[3] = 0;
      local_1368.data._M_elems[4] = 0;
      local_1368.data._M_elems[5] = 0;
      local_1368.data._M_elems._24_5_ = 0;
      local_1368.data._M_elems[7]._1_3_ = 0;
      local_1368.data._M_elems._32_5_ = 0;
      local_1368.data._M_elems[9]._1_3_ = 0;
      local_1368.exp = 0;
      local_1368.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_1368,&u_00->m_backend,&this_00->m_backend);
      local_ed8.fpclass = cpp_dec_float_finite;
      local_ed8.prec_elem = 10;
      local_ed8.data._M_elems[0] = 0;
      local_ed8.data._M_elems[1] = 0;
      local_ed8.data._M_elems[2] = 0;
      local_ed8.data._M_elems[3] = 0;
      local_ed8.data._M_elems[4] = 0;
      local_ed8.data._M_elems[5] = 0;
      local_ed8.data._M_elems._24_5_ = 0;
      local_ed8.data._M_elems[7]._1_3_ = 0;
      local_ed8.data._M_elems._32_5_ = 0;
      local_ed8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_ed8,&u->m_backend,&local_1368);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_4c8,this);
      bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_e98,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_ed8,&local_4c8);
      if (!bVar11) {
        iVar12 = this->m_k;
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_f18.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8);
        local_f18.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[iVar12].m_backend.data;
        local_f18.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2);
        puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
        local_f18.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_f18.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_f18.m_backend.exp = pnVar17[iVar12].m_backend.exp;
        local_f18.m_backend.neg = pnVar17[iVar12].m_backend.neg;
        local_f18.m_backend.fpclass = pnVar17[iVar12].m_backend.fpclass;
        local_f18.m_backend.prec_elem = pnVar17[iVar12].m_backend.prec_elem;
        local_1368.fpclass = cpp_dec_float_finite;
        local_1368.prec_elem = 10;
        local_1368.data._M_elems[0] = 0;
        local_1368.data._M_elems[1] = 0;
        local_1368.data._M_elems[2] = 0;
        local_1368.data._M_elems[3] = 0;
        local_1368.data._M_elems[4] = 0;
        local_1368.data._M_elems[5] = 0;
        local_1368.data._M_elems._24_5_ = 0;
        local_1368.data._M_elems[7]._1_3_ = 0;
        local_1368.data._M_elems._32_5_ = 0;
        local_1368.data._M_elems[9]._1_3_ = 0;
        local_1368.exp = 0;
        local_1368.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1368,&u_00->m_backend,&this_00->m_backend);
        local_f58.fpclass = cpp_dec_float_finite;
        local_f58.prec_elem = 10;
        local_f58.data._M_elems[0] = 0;
        local_f58.data._M_elems[1] = 0;
        local_f58.data._M_elems[2] = 0;
        local_f58.data._M_elems[3] = 0;
        local_f58.data._M_elems[4] = 0;
        local_f58.data._M_elems[5] = 0;
        local_f58.data._M_elems._24_5_ = 0;
        local_f58.data._M_elems[7]._1_3_ = 0;
        local_f58.data._M_elems._32_5_ = 0;
        local_f58._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_f58,&pnVar5->m_backend,&local_1368);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_500,this);
        bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_f18,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_f58,&local_500);
        if (bVar11) {
          ::soplex::infinity::__tls_init();
          local_1328.fpclass = cpp_dec_float_finite;
          local_1328.prec_elem = 10;
          local_1328.data._M_elems[0] = 0;
          local_1328.data._M_elems[1] = 0;
          local_1328.data._M_elems[2] = 0;
          local_1328.data._M_elems[3] = 0;
          local_1328.data._M_elems[4] = 0;
          local_1328.data._M_elems[5] = 0;
          local_1328.data._M_elems._24_5_ = 0;
          local_1328.data._M_elems[7]._1_3_ = 0;
          local_1328.data._M_elems._32_5_ = 0;
          local_1328.data._M_elems[9]._1_3_ = 0;
          local_1328.exp = 0;
          local_1328.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1328,
                     (double)CONCAT44(uStack_1294,local_1298));
          if ((((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_1328.fpclass != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&this_00->m_backend,&local_1328), 0 < iVar12)) {
            VVar15 = ON_LOWER;
            if ((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) {
              fVar3 = (this->m_upJ).m_backend.fpclass;
              goto joined_r0x0030c91b;
            }
            goto LAB_0030d707;
          }
        }
        iVar12 = this->m_k;
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_f98.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8);
        local_f98.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[iVar12].m_backend.data;
        local_f98.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2);
        puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
        local_f98.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_f98.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_f98.m_backend.exp = pnVar17[iVar12].m_backend.exp;
        local_f98.m_backend.neg = pnVar17[iVar12].m_backend.neg;
        local_f98.m_backend.fpclass = pnVar17[iVar12].m_backend.fpclass;
        local_f98.m_backend.prec_elem = pnVar17[iVar12].m_backend.prec_elem;
        pcVar22 = &(this->m_upJ).m_backend;
        local_1368.fpclass = cpp_dec_float_finite;
        local_1368.prec_elem = 10;
        local_1368.data._M_elems[0] = 0;
        local_1368.data._M_elems[1] = 0;
        local_1368.data._M_elems[2] = 0;
        local_1368.data._M_elems[3] = 0;
        local_1368.data._M_elems[4] = 0;
        local_1368.data._M_elems[5] = 0;
        local_1368.data._M_elems._24_5_ = 0;
        local_1368.data._M_elems[7]._1_3_ = 0;
        local_1368.data._M_elems._32_5_ = 0;
        local_1368.data._M_elems[9]._1_3_ = 0;
        local_1368.exp = 0;
        local_1368.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1368,&u_00->m_backend,pcVar22);
        local_fd8.fpclass = cpp_dec_float_finite;
        local_fd8.prec_elem = 10;
        local_fd8.data._M_elems[0] = 0;
        local_fd8.data._M_elems[1] = 0;
        local_fd8.data._M_elems[2] = 0;
        local_fd8.data._M_elems[3] = 0;
        local_fd8.data._M_elems[4] = 0;
        local_fd8.data._M_elems[5] = 0;
        local_fd8.data._M_elems._24_5_ = 0;
        local_fd8.data._M_elems[7]._1_3_ = 0;
        local_fd8.data._M_elems._32_5_ = 0;
        local_fd8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_fd8,&u->m_backend,&local_1368);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_538,this);
        bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_f98,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_fd8,&local_538);
        if (bVar11) {
          ::soplex::infinity::__tls_init();
          local_1328.fpclass = cpp_dec_float_finite;
          local_1328.prec_elem = 10;
          local_1328.data._M_elems[0] = 0;
          local_1328.data._M_elems[1] = 0;
          local_1328.data._M_elems[2] = 0;
          local_1328.data._M_elems[3] = 0;
          local_1328.data._M_elems[4] = 0;
          local_1328.data._M_elems[5] = 0;
          local_1328.data._M_elems._24_5_ = 0;
          local_1328.data._M_elems[7]._1_3_ = 0;
          local_1328.data._M_elems._32_5_ = 0;
          local_1328.data._M_elems[9]._1_3_ = 0;
          local_1328.exp = 0;
          local_1328.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1328,local_12a8);
          if ((((this->m_upK).m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_1328.fpclass != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&u->m_backend,&local_1328), iVar12 < 0)) {
            if ((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) {
              fVar3 = (this->m_upK).m_backend.fpclass;
              goto LAB_0030ceb3;
            }
LAB_0030da3a:
            VVar15 = ON_UPPER;
            goto LAB_0030da3f;
          }
        }
        iVar12 = this->m_k;
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1018.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8);
        local_1018.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[iVar12].m_backend.data;
        local_1018.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2);
        puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
        local_1018.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_1018.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_1018.m_backend.exp = pnVar17[iVar12].m_backend.exp;
        local_1018.m_backend.neg = pnVar17[iVar12].m_backend.neg;
        local_1018.m_backend.fpclass = pnVar17[iVar12].m_backend.fpclass;
        local_1018.m_backend.prec_elem = pnVar17[iVar12].m_backend.prec_elem;
        local_1368.fpclass = cpp_dec_float_finite;
        local_1368.prec_elem = 10;
        local_1368.data._M_elems[0] = 0;
        local_1368.data._M_elems[1] = 0;
        local_1368.data._M_elems[2] = 0;
        local_1368.data._M_elems[3] = 0;
        local_1368.data._M_elems[4] = 0;
        local_1368.data._M_elems[5] = 0;
        local_1368.data._M_elems._24_5_ = 0;
        local_1368.data._M_elems[7]._1_3_ = 0;
        local_1368.data._M_elems._32_5_ = 0;
        local_1368.data._M_elems[9]._1_3_ = 0;
        local_1368.exp = 0;
        local_1368.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1368,&u_00->m_backend,pcVar22);
        local_1058.fpclass = cpp_dec_float_finite;
        local_1058.prec_elem = 10;
        local_1058.data._M_elems[0] = 0;
        local_1058.data._M_elems[1] = 0;
        local_1058.data._M_elems[2] = 0;
        local_1058.data._M_elems[3] = 0;
        local_1058.data._M_elems[4] = 0;
        local_1058.data._M_elems[5] = 0;
        local_1058.data._M_elems._24_5_ = 0;
        local_1058.data._M_elems[7]._1_3_ = 0;
        local_1058.data._M_elems._32_5_ = 0;
        local_1058._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1058,&pnVar5->m_backend,&local_1368);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_570,this);
        bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_1018,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1058,&local_570);
        if (bVar11) {
          ::soplex::infinity::__tls_init();
          local_1328.fpclass = cpp_dec_float_finite;
          local_1328.prec_elem = 10;
          local_1328.data._M_elems[0] = 0;
          local_1328.data._M_elems[1] = 0;
          local_1328.data._M_elems[2] = 0;
          local_1328.data._M_elems[3] = 0;
          local_1328.data._M_elems[4] = 0;
          local_1328.data._M_elems[5] = 0;
          local_1328.data._M_elems._24_5_ = 0;
          local_1328.data._M_elems[7]._1_3_ = 0;
          local_1328.data._M_elems._32_5_ = 0;
          local_1328.data._M_elems[9]._1_3_ = 0;
          local_1328.exp = 0;
          local_1328.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1328,local_12a8);
          if ((((this->m_upJ).m_backend.fpclass == cpp_dec_float_NaN) ||
              (local_1328.fpclass == cpp_dec_float_NaN)) ||
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar22,&local_1328), -1 < iVar12)) goto LAB_0030d334;
          VVar15 = ON_UPPER;
          if ((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) {
            fVar3 = (this->m_upJ).m_backend.fpclass;
            goto joined_r0x0030d1a9;
          }
LAB_0030d794:
          iVar12 = this->m_j;
          pVVar19 = cStatus->data;
          goto LAB_0030d8b2;
        }
LAB_0030d334:
        iVar12 = this->m_k;
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1098.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8);
        local_1098.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[iVar12].m_backend.data;
        local_1098.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2);
        puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
        local_1098.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_1098.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_1098.m_backend.exp = pnVar17[iVar12].m_backend.exp;
        local_1098.m_backend.neg = pnVar17[iVar12].m_backend.neg;
        local_1098.m_backend.fpclass = pnVar17[iVar12].m_backend.fpclass;
        local_1098.m_backend.prec_elem = pnVar17[iVar12].m_backend.prec_elem;
        local_1368.fpclass = cpp_dec_float_finite;
        local_1368.prec_elem = 10;
        local_1368.data._M_elems[0] = 0;
        local_1368.data._M_elems[1] = 0;
        local_1368.data._M_elems[2] = 0;
        local_1368.data._M_elems[3] = 0;
        local_1368.data._M_elems[4] = 0;
        local_1368.data._M_elems[5] = 0;
        local_1368.data._M_elems._24_5_ = 0;
        local_1368.data._M_elems[7]._1_3_ = 0;
        local_1368.data._M_elems._32_5_ = 0;
        local_1368.data._M_elems[9]._1_3_ = 0;
        local_1368.exp = 0;
        local_1368.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1368,&u_00->m_backend,pcVar22);
        local_10d8.fpclass = cpp_dec_float_finite;
        local_10d8.prec_elem = 10;
        local_10d8.data._M_elems[0] = 0;
        local_10d8.data._M_elems[1] = 0;
        local_10d8.data._M_elems[2] = 0;
        local_10d8.data._M_elems[3] = 0;
        local_10d8.data._M_elems[4] = 0;
        local_10d8.data._M_elems[5] = 0;
        local_10d8.data._M_elems._24_5_ = 0;
        local_10d8.data._M_elems[7]._1_3_ = 0;
        local_10d8.data._M_elems._32_5_ = 0;
        local_10d8._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_10d8,&pnVar5->m_backend,&local_1368);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_5a8,this);
        bVar11 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_1098,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_10d8,&local_5a8);
        if (!bVar11) {
LAB_0030d5df:
          iVar12 = this->m_k;
          pnVar17 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1118.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8);
          local_1118.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[iVar12].m_backend.data;
          local_1118.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2);
          puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
          local_1118.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_1118.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_1118.m_backend.exp = pnVar17[iVar12].m_backend.exp;
          local_1118.m_backend.neg = pnVar17[iVar12].m_backend.neg;
          local_1118.m_backend.fpclass = pnVar17[iVar12].m_backend.fpclass;
          local_1118.m_backend.prec_elem = pnVar17[iVar12].m_backend.prec_elem;
          local_1368.fpclass = cpp_dec_float_finite;
          local_1368.prec_elem = 10;
          local_1368.data._M_elems[0] = 0;
          local_1368.data._M_elems[1] = 0;
          local_1368.data._M_elems[2] = 0;
          local_1368.data._M_elems[3] = 0;
          local_1368.data._M_elems[4] = 0;
          local_1368.data._M_elems[5] = 0;
          local_1368.data._M_elems._24_5_ = 0;
          local_1368.data._M_elems[7]._1_3_ = 0;
          local_1368.data._M_elems._32_5_ = 0;
          local_1368.data._M_elems[9]._1_3_ = 0;
          local_1368.exp = 0;
          local_1368.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_1368,&u_00->m_backend,pcVar22);
          local_1158.fpclass = cpp_dec_float_finite;
          local_1158.prec_elem = 10;
          local_1158.data._M_elems[0] = 0;
          local_1158.data._M_elems[1] = 0;
          local_1158.data._M_elems[2] = 0;
          local_1158.data._M_elems[3] = 0;
          local_1158.data._M_elems[4] = 0;
          local_1158.data._M_elems[5] = 0;
          local_1158.data._M_elems._24_5_ = 0;
          local_1158.data._M_elems[7]._1_3_ = 0;
          local_1158.data._M_elems._32_5_ = 0;
          local_1158._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_1158,&pnVar5->m_backend,&local_1368);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_5e0,this);
          bVar11 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_1118,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1158,&local_5e0);
          if (!bVar11) {
            puVar14 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_1368.data._M_elems._0_8_ = local_1368.data._M_elems + 4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1368,"XMAISM09 This should never happen.","");
            *puVar14 = &PTR__SPxException_0069d438;
            puVar14[1] = puVar14 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar14 + 1),local_1368.data._M_elems._0_8_,
                       (undefined1 *)
                       (local_1368.data._M_elems._0_8_ + local_1368.data._M_elems._8_8_));
            *puVar14 = &PTR__SPxException_0069d410;
            __cxa_throw(puVar14,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          VVar15 = ON_UPPER;
          if ((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) {
            fVar3 = (this->m_upJ).m_backend.fpclass;
joined_r0x0030d1a9:
            VVar15 = ON_UPPER;
            if (fVar3 != cpp_dec_float_NaN) {
              iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&this_00->m_backend,pcVar22);
              VVar15 = (uint)(iVar12 == 0) * 2;
            }
          }
          goto LAB_0030d794;
        }
        ::soplex::infinity::__tls_init();
        local_1328.fpclass = cpp_dec_float_finite;
        local_1328.prec_elem = 10;
        local_1328.data._M_elems[0] = 0;
        local_1328.data._M_elems[1] = 0;
        local_1328.data._M_elems[2] = 0;
        local_1328.data._M_elems[3] = 0;
        local_1328.data._M_elems[4] = 0;
        local_1328.data._M_elems[5] = 0;
        local_1328.data._M_elems._24_5_ = 0;
        local_1328.data._M_elems[7]._1_3_ = 0;
        local_1328.data._M_elems._32_5_ = 0;
        local_1328.data._M_elems[9]._1_3_ = 0;
        local_1328.exp = 0;
        local_1328.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1328,
                   (double)CONCAT44(uStack_1294,local_1298));
        if ((((this->m_loK).m_backend.fpclass == cpp_dec_float_NaN) ||
            (local_1328.fpclass == cpp_dec_float_NaN)) ||
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&pnVar5->m_backend,&local_1328), iVar12 < 1)) goto LAB_0030d5df;
        if ((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) {
          fVar3 = (this->m_upK).m_backend.fpclass;
          goto LAB_0030d48b;
        }
LAB_0030d7db:
        VVar15 = ON_LOWER;
LAB_0030d7e0:
        iVar12 = this->m_k;
        cStatus->data[iVar12] = VVar15;
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 8) =
             *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8);
        uVar20 = *(undefined8 *)(pnVar5->m_backend).data._M_elems;
        uVar7 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2);
        uVar8 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6);
        puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4);
        *(undefined8 *)(puVar2 + 2) = uVar8;
        *(undefined8 *)&pnVar17[iVar12].m_backend.data = uVar20;
        *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2) = uVar7;
        pnVar17[iVar12].m_backend.exp = (this->m_loK).m_backend.exp;
        pnVar17[iVar12].m_backend.neg = (this->m_loK).m_backend.neg;
        iVar9 = (this->m_loK).m_backend.prec_elem;
        pnVar17[iVar12].m_backend.fpclass = (this->m_loK).m_backend.fpclass;
        pnVar17[iVar12].m_backend.prec_elem = iVar9;
        cStatus->data[this->m_j] = BASIC;
        local_1328.data._M_elems._32_5_ = local_1248.data._M_elems._32_5_;
        local_1328.data._M_elems[9]._1_3_ = local_1248.data._M_elems[9]._1_3_;
        local_1328.data._M_elems[4] = local_1248.data._M_elems[4];
        local_1328.data._M_elems[5] = local_1248.data._M_elems[5];
        local_1328.data._M_elems._24_5_ =
             SUB85(CONCAT44(local_1248.data._M_elems[7],local_1248.data._M_elems[6]),0);
        local_1328.data._M_elems[7]._1_3_ = (undefined3)(local_1248.data._M_elems[7] >> 8);
        local_1328.data._M_elems[0] = local_1248.data._M_elems[0];
        local_1328.data._M_elems[1] = local_1248.data._M_elems[1];
        local_1328.data._M_elems[2] = local_1248.data._M_elems[2];
        local_1328.data._M_elems[3] = local_1248.data._M_elems[3];
        local_1328.exp = local_1248.exp;
        local_1328.neg = local_1248.neg;
        local_1328.fpclass = local_1248.fpclass;
        local_1328.prec_elem = local_1248.prec_elem;
        pcVar22 = &local_12e8;
LAB_0030daf1:
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_1328,pcVar22);
        local_1368.fpclass = cpp_dec_float_finite;
        local_1368.prec_elem = 10;
        local_1368.data._M_elems[0] = 0;
        local_1368.data._M_elems[1] = 0;
        local_1368.data._M_elems[2] = 0;
        local_1368.data._M_elems[3] = 0;
        local_1368.data._M_elems[4] = 0;
        local_1368.data._M_elems[5] = 0;
        local_1368.data._M_elems._24_5_ = 0;
        local_1368.data._M_elems[7]._1_3_ = 0;
        local_1368.data._M_elems._32_5_ = 0;
        local_1368.data._M_elems[9]._1_3_ = 0;
        local_1368.exp = 0;
        local_1368.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1368,&local_1328,&u_00->m_backend);
        iVar12 = this->m_j;
        pnVar17 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)(pnVar17[iVar12].m_backend.data._M_elems + 8) =
             CONCAT35(local_1368.data._M_elems[9]._1_3_,local_1368.data._M_elems._32_5_);
        puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_1368.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_1368.data._M_elems[7]._1_3_,local_1368.data._M_elems._24_5_);
        *(undefined8 *)&pnVar17[iVar12].m_backend.data = local_1368.data._M_elems._0_8_;
        *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2) =
             local_1368.data._M_elems._8_8_;
        pnVar17[iVar12].m_backend.exp = local_1368.exp;
        pnVar17[iVar12].m_backend.neg = local_1368.neg;
        pnVar17[iVar12].m_backend.fpclass = local_1368.fpclass;
        pnVar17[iVar12].m_backend.prec_elem = local_1368.prec_elem;
        break;
      }
      VVar15 = ON_LOWER;
      if ((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) {
        fVar3 = (this->m_upJ).m_backend.fpclass;
joined_r0x0030c91b:
        VVar15 = ON_LOWER;
        if (fVar3 != cpp_dec_float_NaN) {
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&this_00->m_backend,&(this->m_upJ).m_backend);
          VVar15 = (iVar12 == 0) + ON_LOWER;
        }
      }
LAB_0030d707:
      iVar12 = this->m_j;
      pVVar19 = cStatus->data;
LAB_0030d74b:
      lVar13 = (long)iVar12;
      pVVar19[lVar13] = VVar15;
      pnVar17 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar17[lVar13].m_backend.data._M_elems + 8) =
           *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8);
      uVar20 = *(undefined8 *)(this_00->m_backend).data._M_elems;
      uVar7 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2);
      uVar8 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6);
      puVar2 = pnVar17[lVar13].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar2 + 2) = uVar8;
      *(undefined8 *)&pnVar17[lVar13].m_backend.data = uVar20;
      *(undefined8 *)(pnVar17[lVar13].m_backend.data._M_elems + 2) = uVar7;
      pnVar17[lVar13].m_backend.exp = (this->m_loJ).m_backend.exp;
      pnVar17[lVar13].m_backend.neg = (this->m_loJ).m_backend.neg;
      uVar20._0_4_ = (this->m_loJ).m_backend.fpclass;
      uVar20._4_4_ = (this->m_loJ).m_backend.prec_elem;
    }
    *(undefined8 *)&pnVar17[lVar13].m_backend.fpclass = uVar20;
    local_1368.fpclass = cpp_dec_float_finite;
    local_1368.prec_elem = 10;
    local_1368.data._M_elems[0] = 0;
    local_1368.data._M_elems[1] = 0;
    local_1368.data._M_elems[2] = 0;
    local_1368.data._M_elems[3] = 0;
    local_1368.data._M_elems[4] = 0;
    local_1368.data._M_elems[5] = 0;
    local_1368.data._M_elems._24_5_ = 0;
    local_1368.data._M_elems[7]._1_3_ = 0;
    local_1368.data._M_elems._32_5_ = 0;
    local_1368.data._M_elems[9]._1_3_ = 0;
    local_1368.exp = 0;
    local_1368.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_1368,&u_00->m_backend,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&local_1368);
  }
  pcVar21 = &(r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend;
  pnVar5 = &this->m_scale;
  local_12e8.fpclass = cpp_dec_float_finite;
  local_12e8.prec_elem = 10;
  local_12e8.data._M_elems[0] = 0;
  local_12e8.data._M_elems[1] = 0;
  local_12e8.data._M_elems[2] = 0;
  local_12e8.data._M_elems[3] = 0;
  local_12e8.data._M_elems[4] = 0;
  local_12e8.data._M_elems[5] = 0;
  local_12e8.data._M_elems._24_5_ = 0;
  local_12e8.data._M_elems[7]._1_3_ = 0;
  local_12e8.data._M_elems._32_5_ = 0;
  local_12e8.data._M_elems[9]._1_3_ = 0;
  local_12e8.exp = 0;
  local_12e8.neg = false;
  pcVar22 = &pnVar5->m_backend;
  if ((&local_12e8 != pcVar21) && (pcVar22 = pcVar21, &local_12e8 != &pnVar5->m_backend)) {
    uVar20 = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 8);
    local_12e8.data._M_elems._32_5_ = SUB85(uVar20,0);
    local_12e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar20 >> 0x28);
    local_12e8.data._M_elems._0_8_ = *(undefined8 *)(pnVar5->m_backend).data._M_elems;
    local_12e8.data._M_elems._8_8_ = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 2);
    local_12e8.data._M_elems._16_8_ = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 4);
    uVar20 = *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 6);
    local_12e8.data._M_elems._24_5_ = SUB85(uVar20,0);
    local_12e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar20 >> 0x28);
    local_12e8.exp = (this->m_scale).m_backend.exp;
    local_12e8.neg = (this->m_scale).m_backend.neg;
    local_12e8.fpclass = (this->m_scale).m_backend.fpclass;
    local_12e8.prec_elem = (this->m_scale).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_12e8,pcVar22);
  iVar12 = this->m_j;
  pnVar17 = (r->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar17[iVar12].m_backend.data._M_elems + 8) =
       CONCAT35(local_12e8.data._M_elems[9]._1_3_,local_12e8.data._M_elems._32_5_);
  puVar2 = pnVar17[iVar12].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_12e8.data._M_elems._16_8_;
  *(ulong *)(puVar2 + 2) =
       CONCAT35(local_12e8.data._M_elems[7]._1_3_,local_12e8.data._M_elems._24_5_);
  *(undefined8 *)&pnVar17[iVar12].m_backend.data = local_12e8.data._M_elems._0_8_;
  *(undefined8 *)(pnVar17[iVar12].m_backend.data._M_elems + 2) = local_12e8.data._M_elems._8_8_;
  pnVar17[iVar12].m_backend.exp = local_12e8.exp;
  pnVar17[iVar12].m_backend.neg = local_12e8.neg;
  pnVar17[iVar12].m_backend.fpclass = local_12e8.fpclass;
  pnVar17[iVar12].m_backend.prec_elem = local_12e8.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}